

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree.h
# Opt level: O2

istream * Gudhi::operator>>(istream *is,Simplex_tree<Gudhi::Simplex_tree_options_default> *st)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  vector<int,_std::allocator<int>_> simplex;
  Filtration_value fil;
  
  simplex.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  simplex.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  simplex.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  iVar3 = -1;
  while( true ) {
    bVar1 = read_simplex<int,double>(is,&simplex,&fil);
    if (!bVar1) break;
    iVar2 = (int)((ulong)((long)simplex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_finish -
                         (long)simplex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start) >> 2) + -1;
    if (iVar3 <= iVar2) {
      iVar3 = iVar2;
    }
    Simplex_tree<Gudhi::Simplex_tree_options_default>::
    insert_simplex<std::vector<int,std::allocator<int>>>
              ((Simplex_tree<Gudhi::Simplex_tree_options_default> *)&stack0xffffffffffffffc0,
               (vector<int,_std::allocator<int>_> *)st,(Filtration_value *)&simplex);
    if (simplex.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish !=
        simplex.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start) {
      simplex.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = simplex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
    }
  }
  st->dimension_to_be_lowered_ = false;
  st->dimension_ = iVar3;
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&simplex.super__Vector_base<int,_std::allocator<int>_>);
  return is;
}

Assistant:

std::istream& operator>>(std::istream & is, Simplex_tree<T...> & st) {
  typedef Simplex_tree<T...> ST;
  std::vector<typename ST::Vertex_handle> simplex;
  typename ST::Filtration_value fil;
  int max_dim = -1;
  while (read_simplex(is, simplex, fil)) {
    // read all simplices in the file as a list of vertices
    // Warning : simplex_size needs to be casted in int - Can be 0
    int dim = static_cast<int> (simplex.size() - 1);
    if (max_dim < dim) {
      max_dim = dim;
    }
    // insert every simplex in the simplex tree
    st.insert_simplex(simplex, fil);
    simplex.clear();
  }
  st.set_dimension(max_dim);

  return is;
}